

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *pEVar1;
  ushort uVar2;
  enet_uint16 eVar3;
  ushort uVar4;
  int iVar5;
  _ENetListNode *p_Var6;
  _ENetListNode *p_Var7;
  _ENetListNode *p_Var8;
  _ENetHost *p_Var9;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var10;
  ENetListIterator first;
  ENetIncomingCommand *startCommand;
  ENetIncomingCommand *excludeCommand;
  ENetIncomingCommand *pEVar11;
  ushort uVar12;
  
  pEVar1 = &channel->incomingReliableCommands;
  p_Var10 = &pEVar1->sentinel;
  while (((p_Var10 = ((ENetListNode *)&p_Var10->next)->next, p_Var10 != &pEVar1->sentinel &&
          (*(int *)&p_Var10[4].previous == 0)) &&
         (eVar3 = *(enet_uint16 *)&p_Var10[1].next,
         eVar3 == (enet_uint16)(channel->incomingReliableSequenceNumber + 1)))) {
    channel->incomingReliableSequenceNumber = eVar3;
    iVar5 = *(int *)((long)&p_Var10[4].next + 4);
    if (iVar5 != 0) {
      channel->incomingReliableSequenceNumber = (eVar3 + (short)iVar5) - 1;
    }
  }
  p_Var6 = (pEVar1->sentinel).next;
  if (p_Var10 != p_Var6) {
    channel->incomingUnreliableSequenceNumber = 0;
    p_Var10 = p_Var10->previous;
    p_Var7 = p_Var10->next;
    p_Var8 = p_Var6->previous;
    p_Var8->next = p_Var7;
    p_Var7->previous = p_Var8;
    p_Var7 = (peer->dispatchedCommands).sentinel.previous;
    p_Var6->previous = p_Var7;
    p_Var10->next = &(peer->dispatchedCommands).sentinel;
    p_Var7->next = p_Var6;
    (peer->dispatchedCommands).sentinel.previous = p_Var10;
    uVar4 = peer->flags;
    if ((uVar4 & 1) == 0) {
      p_Var9 = peer->host;
      p_Var10 = (p_Var9->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var10;
      (peer->dispatchList).next = &(p_Var9->dispatchQueue).sentinel;
      p_Var10->next = &peer->dispatchList;
      (p_Var9->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->flags = uVar4 | 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      pEVar1 = &peer->dispatchedCommands;
      startCommand = (ENetIncomingCommand *)(channel->incomingUnreliableCommands).sentinel.next;
      pEVar11 = startCommand;
      for (excludeCommand = startCommand;
          excludeCommand != (ENetIncomingCommand *)&channel->incomingUnreliableCommands;
          excludeCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next) {
        if (((excludeCommand->command).header.command & 0xf) != 9) {
          uVar4 = excludeCommand->reliableSequenceNumber;
          uVar2 = channel->incomingReliableSequenceNumber;
          if (uVar4 == uVar2) {
            if (excludeCommand->fragmentsRemaining == 0) {
              channel->incomingUnreliableSequenceNumber = excludeCommand->unreliableSequenceNumber;
              goto LAB_001063bb;
            }
            if (pEVar11 == excludeCommand) {
              if (startCommand != excludeCommand) {
                startCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).previous
                ;
              }
            }
            else {
              p_Var10 = (excludeCommand->incomingCommandList).previous;
              p_Var6 = p_Var10->next;
              p_Var7 = (pEVar11->incomingCommandList).previous;
              p_Var7->next = p_Var6;
              p_Var6->previous = p_Var7;
              p_Var6 = (peer->dispatchedCommands).sentinel.previous;
              (pEVar11->incomingCommandList).previous = p_Var6;
              p_Var10->next = &pEVar1->sentinel;
              p_Var6->next = &pEVar11->incomingCommandList;
              (peer->dispatchedCommands).sentinel.previous = p_Var10;
              uVar4 = peer->flags;
              startCommand = excludeCommand;
              if ((uVar4 & 1) == 0) {
                p_Var9 = peer->host;
                p_Var10 = (p_Var9->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var10;
                (peer->dispatchList).next = &(p_Var9->dispatchQueue).sentinel;
                p_Var10->next = &peer->dispatchList;
                (p_Var9->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->flags = uVar4 | 1;
              }
            }
          }
          else {
            uVar12 = (uVar4 >> 0xc) + 0x10;
            if (uVar2 <= uVar4) {
              uVar12 = uVar4 >> 0xc;
            }
            if (uVar2 >> 0xc <= uVar12 && uVar12 < (ushort)((uVar2 >> 0xc) + 7)) break;
            startCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
            if (pEVar11 != excludeCommand) {
              p_Var10 = (excludeCommand->incomingCommandList).previous;
              p_Var6 = p_Var10->next;
              p_Var7 = (pEVar11->incomingCommandList).previous;
              p_Var7->next = p_Var6;
              p_Var6->previous = p_Var7;
              p_Var6 = (peer->dispatchedCommands).sentinel.previous;
              (pEVar11->incomingCommandList).previous = p_Var6;
              p_Var10->next = &pEVar1->sentinel;
              p_Var6->next = &pEVar11->incomingCommandList;
              (peer->dispatchedCommands).sentinel.previous = p_Var10;
              uVar4 = peer->flags;
              if ((uVar4 & 1) == 0) {
                p_Var9 = peer->host;
                p_Var10 = (p_Var9->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var10;
                (peer->dispatchList).next = &(p_Var9->dispatchQueue).sentinel;
                p_Var10->next = &peer->dispatchList;
                (p_Var9->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->flags = uVar4 | 1;
              }
            }
          }
          pEVar11 = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
        }
LAB_001063bb:
      }
      if (pEVar11 != excludeCommand) {
        p_Var10 = (excludeCommand->incomingCommandList).previous;
        p_Var6 = p_Var10->next;
        p_Var7 = (pEVar11->incomingCommandList).previous;
        p_Var7->next = p_Var6;
        p_Var6->previous = p_Var7;
        p_Var6 = (peer->dispatchedCommands).sentinel.previous;
        (pEVar11->incomingCommandList).previous = p_Var6;
        p_Var10->next = &pEVar1->sentinel;
        p_Var6->next = &pEVar11->incomingCommandList;
        (peer->dispatchedCommands).sentinel.previous = p_Var10;
        uVar4 = peer->flags;
        startCommand = excludeCommand;
        if ((uVar4 & 1) == 0) {
          p_Var9 = peer->host;
          p_Var10 = (p_Var9->dispatchQueue).sentinel.previous;
          (peer->dispatchList).previous = p_Var10;
          (peer->dispatchList).next = &(p_Var9->dispatchQueue).sentinel;
          p_Var10->next = &peer->dispatchList;
          (p_Var9->dispatchQueue).sentinel.previous = &peer->dispatchList;
          peer->flags = uVar4 | 1;
        }
      }
      enet_peer_remove_incoming_commands
                (peer,(ENetList *)(channel->incomingUnreliableCommands).sentinel.next,
                 &startCommand->incomingCommandList,&queuedCommand->incomingCommandList,
                 excludeCommand);
      return;
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer, ENetChannel *channel, ENetIncomingCommand *queuedCommand) {
        ENetListIterator currentCommand;

        for (currentCommand = enet_list_begin(&channel->incomingReliableCommands);
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_next(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (enet_uint16) (channel->incomingReliableSequenceNumber + 1)) {
                break;
            }

            channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

            if (incomingCommand->fragmentCount > 0) {
                channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
            }
        }

        if (currentCommand == enet_list_begin(&channel->incomingReliableCommands)) {
            return;
        }

        channel->incomingUnreliableSequenceNumber = 0;
        enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

        if (!(peer->flags & ENET_PEER_FLAG_NEEDS_DISPATCH)) {
            enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);
            peer->flags |= ENET_PEER_FLAG_NEEDS_DISPATCH;
        }

        if (!enet_list_empty(&channel->incomingUnreliableCommands)) {
            enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
        }
    }